

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O0

void __thiscall gdscpp::gdscpp(gdscpp *this)

{
  allocator<char> local_11;
  gdscpp *local_10;
  gdscpp *this_local;
  
  this->version_number = 7;
  this->generations = 3;
  this->highest_heirarchical_level = 0;
  this->units[0] = 0.001;
  this->units[1] = 1e-09;
  local_10 = this;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->STR_Lookup);
  std::vector<int,_std::allocator<int>_>::vector(&this->last_modified);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->library_name,"Untitled_library",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->GDSfileName);
  std::vector<gdsSTR,_std::allocator<gdsSTR>_>::vector(&this->STR);
  return;
}

Assistant:

~gdscpp(){}